

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_bitmap_glyph_init(FT_Glyph bitmap_glyph,FT_GlyphSlot slot)

{
  FT_Library library_00;
  FT_Library library;
  FT_Error error;
  FT_BitmapGlyph glyph;
  FT_GlyphSlot slot_local;
  FT_Glyph bitmap_glyph_local;
  
  library._4_4_ = 0;
  library_00 = bitmap_glyph->library;
  if (slot->format == FT_GLYPH_FORMAT_BITMAP) {
    *(FT_Int *)&bitmap_glyph[1].library = slot->bitmap_left;
    *(FT_Int *)((long)&bitmap_glyph[1].library + 4) = slot->bitmap_top;
    if ((slot->internal->flags & 1) == 0) {
      FT_Bitmap_Init((FT_Bitmap *)&bitmap_glyph[1].clazz);
      library._4_4_ = FT_Bitmap_Copy(library_00,&slot->bitmap,(FT_Bitmap *)&bitmap_glyph[1].clazz);
    }
    else {
      memcpy(&bitmap_glyph[1].clazz,&slot->bitmap,0x28);
      slot->internal->flags = slot->internal->flags & 0xfffffffe;
    }
  }
  else {
    library._4_4_ = 0x12;
  }
  return library._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_bitmap_glyph_init( FT_Glyph      bitmap_glyph,
                        FT_GlyphSlot  slot )
  {
    FT_BitmapGlyph  glyph   = (FT_BitmapGlyph)bitmap_glyph;
    FT_Error        error   = FT_Err_Ok;
    FT_Library      library = FT_GLYPH( glyph )->library;


    if ( slot->format != FT_GLYPH_FORMAT_BITMAP )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    glyph->left = slot->bitmap_left;
    glyph->top  = slot->bitmap_top;

    /* do lazy copying whenever possible */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      glyph->bitmap          = slot->bitmap;
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }
    else
    {
      FT_Bitmap_Init( &glyph->bitmap );
      error = FT_Bitmap_Copy( library, &slot->bitmap, &glyph->bitmap );
    }

  Exit:
    return error;
  }